

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::set_section(string *section_name)

{
  uint uVar1;
  bool bVar2;
  __type _Var3;
  size_type sVar4;
  reference ppSVar5;
  ulong uVar6;
  Section *this;
  string local_40;
  Section *local_20;
  uint local_18;
  uint local_14;
  uint section_number;
  uint section_flags;
  string *section_name_local;
  
  local_14 = 0;
  _section_number = section_name;
  bVar2 = std::operator==(section_name,".bss");
  if (bVar2) {
    local_14 = 2;
  }
  else {
    bVar2 = std::operator==(section_name,".stack");
    if (!bVar2) {
      local_14 = 1;
    }
  }
  sVar4 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::size
                    ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table);
  if ((sVar4 == 1) &&
     (ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                          ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,0),
     (*ppSVar5)->content_size == 0)) {
    ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,0);
    std::__cxx11::string::operator=((string *)*ppSVar5,(string *)section_name);
    uVar1 = local_14;
    ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,0);
    (*ppSVar5)->flags = uVar1;
  }
  else {
    for (local_18 = 0; uVar6 = (ulong)local_18,
        sVar4 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::size
                          ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table),
        uVar6 < sVar4; local_18 = local_18 + 1) {
      ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                          ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,
                           (ulong)local_18);
      _Var3 = std::operator==(section_name,&(*ppSVar5)->name);
      if (_Var3) {
        ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                            ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,
                             (ulong)local_18);
        current_section = *ppSVar5;
        return;
      }
    }
    this = (Section *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_40,(string *)section_name);
    Section::Section(this,&local_40,local_18,local_14);
    local_20 = this;
    std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::push_back
              ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::back
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table);
    current_section = *ppSVar5;
  }
  return;
}

Assistant:

void Sections::set_section(std::string section_name)
{
	unsigned section_flags = 0;
	if (section_name == ".bss")
		section_flags = Section::BSS;
	else if (section_name == ".stack")
		;
	else
		section_flags = Section::LOADABLE;

	/* A secção .text é sempre criada inicialmente.
	 * Se o utilizador não definir uma secção inicial esta é utilizada.
	 * Se o utilizador começar por definir uma secção,
	 * esta vai substituir a secção .text inicialmente criada.
	 */
	if (table.size() == 1 && table.at(0)->content_size == 0) {
		table.at(0)->name = section_name;
		table.at(0)->flags = section_flags;
		return;
	}

	unsigned section_number;
	for (section_number = 0; section_number < table.size(); ++section_number)
		if (section_name == table.at(section_number)->name) {
			current_section = table.at(section_number);
			return;	/* A secção já existe */
		}
	/* Cria a nova secção */
	table.push_back(new Section {section_name, section_number, section_flags});
	current_section = table.back();
}